

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::FollowLinkEntry(cmComputeLinkDepends *this,BFSEntry *qe)

{
  int depender_index_00;
  bool bVar1;
  TargetType TVar2;
  reference pvVar3;
  LinkInterface *iface_00;
  reference item;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_48;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_40;
  const_iterator oi;
  bool isIface;
  LinkInterface *iface;
  LinkEntry *entry;
  int depender_index;
  BFSEntry *qe_local;
  cmComputeLinkDepends *this_local;
  
  depender_index_00 = qe->Index;
  pvVar3 = std::
           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ::operator[](&this->EntryList,(long)depender_index_00);
  if (pvVar3->Target == (cmTarget *)0x0) {
    AddVarLinkEntries(this,depender_index_00,qe->LibDepends);
  }
  else {
    iface_00 = cmTarget::GetLinkInterface(pvVar3->Target,&this->Config,this->Target);
    if (iface_00 != (LinkInterface *)0x0) {
      TVar2 = cmTarget::GetType(pvVar3->Target);
      oi._M_current._7_1_ = TVar2 == INTERFACE_LIBRARY;
      AddLinkEntries<cmLinkItem>
                (this,depender_index_00,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface_00)
      ;
      if ((oi._M_current._7_1_ & 1) == 0) {
        FollowSharedDeps(this,depender_index_00,iface_00,false);
        local_40._M_current =
             (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                       (&iface_00->WrongConfigLibraries);
        while( true ) {
          local_48._M_current =
               (cmLinkItem *)
               std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                         (&iface_00->WrongConfigLibraries);
          bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
          if (!bVar1) break;
          item = __gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&local_40);
          CheckWrongConfigItem(this,item);
          __gnu_cxx::
          __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
          ::operator++(&local_40);
        }
      }
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::FollowLinkEntry(BFSEntry const& qe)
{
  // Get this entry representation.
  int depender_index = qe.Index;
  LinkEntry const& entry = this->EntryList[depender_index];

  // Follow the item's dependencies.
  if(entry.Target)
    {
    // Follow the target dependencies.
    if(cmTarget::LinkInterface const* iface =
       entry.Target->GetLinkInterface(this->Config, this->Target))
      {
      const bool isIface =
                      entry.Target->GetType() == cmTarget::INTERFACE_LIBRARY;
      // This target provides its own link interface information.
      this->AddLinkEntries(depender_index, iface->Libraries);

      if (isIface)
        {
        return;
        }

      // Handle dependent shared libraries.
      this->FollowSharedDeps(depender_index, iface);

      // Support for CMP0003.
      for(std::vector<cmLinkItem>::const_iterator
            oi = iface->WrongConfigLibraries.begin();
          oi != iface->WrongConfigLibraries.end(); ++oi)
        {
        this->CheckWrongConfigItem(*oi);
        }
      }
    }
  else
    {
    // Follow the old-style dependency list.
    this->AddVarLinkEntries(depender_index, qe.LibDepends);
    }
}